

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_ech_select_hello(ptls_t *tls,ptls_iovec_t message,size_t confirm_hash_off,char *label)

{
  uint8_t *puVar1;
  st_ptls_aead_context_t *__ptr;
  ptls_key_schedule_t *ppVar2;
  st_ptls_hash_context_t *psVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t confirm_hash_expected [8];
  uint8_t confirm_hash_delivered [8];
  undefined1 local_30 [8];
  undefined8 local_28;
  
  puVar5 = message.base;
  if (confirm_hash_off != 0) {
    local_28 = *(undefined8 *)(puVar5 + confirm_hash_off);
    puVar1 = puVar5 + confirm_hash_off;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    iVar4 = ech_calc_confirmation
                      (tls->key_schedule,local_30,(tls->ech).inner_client_random,label,message);
    if (iVar4 != 0) goto LAB_001287cc;
    iVar4 = (*ptls_mem_equal)(&local_28,local_30,8);
    *(byte *)&tls->ech = *(byte *)&tls->ech & 0xfb | ((byte)iVar4 & 1) << 2;
    *(undefined8 *)(puVar5 + confirm_hash_off) = local_28;
    iVar4 = 0;
    if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x4) !=
        (undefined1  [112])0x0) goto LAB_001287cc;
  }
  __ptr = (tls->ech).aead;
  (*__ptr->dispose_crypto)(__ptr);
  free(__ptr);
  (tls->ech).aead = (ptls_aead_context_t *)0x0;
  ppVar2 = tls->key_schedule;
  if (ppVar2->generation != 1) {
    __assert_fail("sched->generation == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x564,"void key_schedule_select_outer(ptls_key_schedule_t *)");
  }
  if (ppVar2->num_hashes != 1) {
    __assert_fail("sched->num_hashes == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x565,"void key_schedule_select_outer(ptls_key_schedule_t *)");
  }
  if (ppVar2->hashes[0].ctx_outer == (ptls_hash_context_t *)0x0) {
    __assert_fail("sched->hashes[0].ctx_outer != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x566,"void key_schedule_select_outer(ptls_key_schedule_t *)");
  }
  psVar3 = ppVar2->hashes[0].ctx;
  iVar4 = 0;
  (*psVar3->final)(psVar3,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
  ppVar2->hashes[0].ctx = ppVar2->hashes[0].ctx_outer;
  ppVar2->hashes[0].ctx_outer = (ptls_hash_context_t *)0x0;
LAB_001287cc:
  if (client_ech_select_hello::logpoint.state.generation != ptls_log._generation) {
    client_ech_select_hello_cold_1();
  }
  if (client_ech_select_hello::logpoint.state.active_conns != 0) {
    client_ech_select_hello_cold_2();
  }
  (*ptls_clear_memory)(local_30,8);
  return iVar4;
}

Assistant:

static int client_ech_select_hello(ptls_t *tls, ptls_iovec_t message, size_t confirm_hash_off, const char *label)
{
    uint8_t confirm_hash_delivered[PTLS_ECH_CONFIRM_LENGTH], confirm_hash_expected[PTLS_ECH_CONFIRM_LENGTH];
    int ret = 0;

    /* Determine if ECH has been accepted by checking the confirmation hash. `confirm_hash_off` set to zero indicates that HRR was
     * received wo. ECH extension, which is an indication that ECH was rejected. */
    if (confirm_hash_off != 0) {
        memcpy(confirm_hash_delivered, message.base + confirm_hash_off, sizeof(confirm_hash_delivered));
        memset(message.base + confirm_hash_off, 0, sizeof(confirm_hash_delivered));
        if ((ret = ech_calc_confirmation(tls->key_schedule, confirm_hash_expected, tls->ech.inner_client_random, label, message)) !=
            0)
            goto Exit;
        tls->ech.accepted = ptls_mem_equal(confirm_hash_delivered, confirm_hash_expected, sizeof(confirm_hash_delivered));
        memcpy(message.base + confirm_hash_off, confirm_hash_delivered, sizeof(confirm_hash_delivered));
        if (tls->ech.accepted)
            goto Exit;
    }

    /* dispose ECH AEAD state to indicate rejection, adopting outer CH for the rest of the handshake */
    ptls_aead_free(tls->ech.aead);
    tls->ech.aead = NULL;
    key_schedule_select_outer(tls->key_schedule);

Exit:
    PTLS_PROBE(ECH_SELECTION, tls, !!tls->ech.accepted);
    PTLS_LOG_CONN(ech_selection, tls, { PTLS_LOG_ELEMENT_BOOL(is_ech, tls->ech.accepted); });
    ptls_clear_memory(confirm_hash_expected, sizeof(confirm_hash_expected));
    return ret;
}